

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O3

int Dar_CutFilter(Aig_Obj_t *pObj,Dar_Cut_t *pCut)

{
  uint uVar1;
  uint uVar2;
  Dar_Cut_t *pDVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  if ((pCut->field_0x7 & 0x10) == 0) {
    __assert_fail("pCut->fUsed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darCut.c"
                  ,0xdd,"int Dar_CutFilter(Aig_Obj_t *, Dar_Cut_t *)");
  }
  uVar4 = *(ulong *)&pObj->field_0x18;
  if (uVar4 >> 0x38 != 0) {
    pDVar3 = (Dar_Cut_t *)(pObj->field_5).pData;
    uVar5 = 0;
    do {
      uVar1 = *(uint *)&pDVar3->field_0x4;
      if (pDVar3 != pCut && (uVar1 >> 0x1c & 1) != 0) {
        uVar9 = uVar1 >> 0x1d;
        uVar2 = *(uint *)&pCut->field_0x4;
        uVar8 = uVar2 >> 0x1d;
        uVar7 = pCut->uSign & pDVar3->uSign;
        if (uVar8 < uVar9) {
          if (uVar7 == pCut->uSign) {
            if ((uVar2 >> 0x1c & 1) == 0) {
LAB_004f4ad2:
              __assert_fail("pDom->fUsed && pCut->fUsed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darCut.c"
                            ,0xc1,"int Dar_CutCheckDominance(Dar_Cut_t *, Dar_Cut_t *)");
            }
            if (0x1fffffff < uVar2) {
              uVar10 = 0;
              do {
                uVar6 = 0;
                if (0x1fffffff < uVar1) {
                  uVar6 = 0;
                  while (pCut->pLeaves[uVar10] != pDVar3->pLeaves[uVar6]) {
                    uVar6 = uVar6 + 1;
                    if (uVar9 == uVar6) goto LAB_004f49c2;
                  }
                }
                if ((uint)uVar6 == uVar9) goto LAB_004f49c2;
                uVar10 = uVar10 + 1;
              } while (uVar10 != uVar8);
            }
            *(uint *)&pDVar3->field_0x4 = uVar1 & 0xefffffff;
            uVar4 = *(ulong *)&pObj->field_0x18;
          }
        }
        else if (uVar7 == pDVar3->uSign) {
          if ((uVar2 >> 0x1c & 1) == 0) goto LAB_004f4ad2;
          if (uVar1 < 0x20000000) {
LAB_004f4abd:
            *(uint *)&pCut->field_0x4 = uVar2 & 0xefffffff;
            return 1;
          }
          uVar10 = 0;
          while( true ) {
            uVar6 = 0;
            if (0x1fffffff < uVar2) {
              uVar6 = 0;
              while (pDVar3->pLeaves[uVar10] != pCut->pLeaves[uVar6]) {
                uVar6 = uVar6 + 1;
                if (uVar8 == uVar6) goto LAB_004f49c2;
              }
            }
            if ((uint)uVar6 == uVar8) break;
            uVar10 = uVar10 + 1;
            if (uVar10 == uVar9) goto LAB_004f4abd;
          }
        }
      }
LAB_004f49c2:
      uVar5 = uVar5 + 1;
      pDVar3 = pDVar3 + 1;
    } while (uVar5 < (byte)(uVar4 >> 0x38));
  }
  return 0;
}

Assistant:

static inline int Dar_CutFilter( Aig_Obj_t * pObj, Dar_Cut_t * pCut )
{ 
    Dar_Cut_t * pTemp;
    int i;
    assert( pCut->fUsed );
    // go through the cuts of the node
    Dar_ObjForEachCut( pObj, pTemp, i )
    {
        if ( pTemp == pCut )
            continue;
        if ( pTemp->nLeaves > pCut->nLeaves )
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
                continue;
            // check containment seriously
            if ( Dar_CutCheckDominance( pCut, pTemp ) )
            {
                // remove contained cut
                pTemp->fUsed = 0;
            }
         }
        else
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( Dar_CutCheckDominance( pTemp, pCut ) )
            {
                // remove the given cut
                pCut->fUsed = 0;
                return 1;
            }
        }
    }
    return 0;
}